

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.c
# Opt level: O0

distance_t metric_soft_distance_quadratic(uint hard_x,uint8_t *soft_y,size_t len)

{
  short sVar1;
  int d;
  uint soft_x;
  uint i;
  distance_t dist;
  size_t len_local;
  uint8_t *soft_y_local;
  uint hard_x_local;
  
  dist = 0;
  hard_x_local = hard_x;
  for (i = 0; i < len; i = i + 1) {
    sVar1 = 0;
    if ((hard_x_local & 1) != 0) {
      sVar1 = 0xff;
    }
    hard_x_local = hard_x_local >> 1;
    dist = dist + ((ushort)soft_y[i] - sVar1) * ((ushort)soft_y[i] - sVar1);
  }
  return (distance_t)((int)(uint)dist >> 3);
}

Assistant:

distance_t metric_soft_distance_quadratic(unsigned int hard_x, const uint8_t *soft_y, size_t len) {
    distance_t dist = 0;
    for (unsigned int i = 0; i < len; i++) {
        // first, convert hard_x to a soft measurement (0 -> 0, 1 - > 255)
        unsigned int soft_x = (hard_x & 1) ? 255 : 0;
        hard_x >>= 1;
        int d = soft_y[i] - soft_x;
        dist += d*d;
    }
    return dist >> 3;
}